

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O3

BigInteger * __thiscall rapidjson::internal::BigInteger::operator<<=(BigInteger *this,size_t shift)

{
  byte bVar1;
  BigInteger *pBVar2;
  RapidJSONException *this_00;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = this->count_;
  if ((shift == 0) || (sVar3 == 1 && this->digits_[0] == 0)) {
    return this;
  }
  uVar4 = shift >> 6;
  if (0x1a0 < sVar3 + uVar4) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: count_ + offset <= kCapacity");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((shift & 0x3f) == 0) {
    memmove(this->digits_ + uVar4,this,sVar3 << 3);
    sVar3 = this->count_ + uVar4;
  }
  else {
    this->digits_[sVar3] = 0;
    for (sVar3 = this->count_; sVar3 != 0; sVar3 = sVar3 - 1) {
      bVar1 = (byte)shift & 0x3f;
      this->digits_[uVar4 + sVar3] =
           this->digits_[sVar3] << bVar1 | this->digits_[sVar3 - 1] >> 0x40 - bVar1;
    }
    this->digits_[uVar4] = this->digits_[0] << ((byte)shift & 0x3f);
    sVar3 = this->count_ + uVar4;
    this->count_ = sVar3;
    if (this->digits_[sVar3] == 0) goto LAB_0015b64c;
    sVar3 = sVar3 + 1;
  }
  this->count_ = sVar3;
LAB_0015b64c:
  pBVar2 = (BigInteger *)memset(this,0,uVar4 << 3);
  return pBVar2;
}

Assistant:

BigInteger& operator<<=(size_t shift) {
        if (IsZero() || shift == 0) return *this;

        size_t offset = shift / kTypeBit;
        size_t interShift = shift % kTypeBit;
        CEREAL_RAPIDJSON_ASSERT(count_ + offset <= kCapacity);

        if (interShift == 0) {
            std::memmove(digits_ + offset, digits_, count_ * sizeof(Type));
            count_ += offset;
        }
        else {
            digits_[count_] = 0;
            for (size_t i = count_; i > 0; i--)
                digits_[i + offset] = (digits_[i] << interShift) | (digits_[i - 1] >> (kTypeBit - interShift));
            digits_[offset] = digits_[0] << interShift;
            count_ += offset;
            if (digits_[count_])
                count_++;
        }

        std::memset(digits_, 0, offset * sizeof(Type));

        return *this;
    }